

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::SplitLayerParams::SerializeWithCachedSizes
          (SplitLayerParams *this,CodedOutputStream *output)

{
  uint64 uVar1;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  SplitLayerParams *this_local;
  
  uVar1 = noutputs(this);
  if (uVar1 != 0) {
    uVar1 = noutputs(this);
    google::protobuf::internal::WireFormatLite::WriteUInt64(1,uVar1,output);
  }
  return;
}

Assistant:

void SplitLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.SplitLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // uint64 nOutputs = 1;
  if (this->noutputs() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(1, this->noutputs(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.SplitLayerParams)
}